

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<double>_>::RegularLink(RegularLink<diy::Bounds<double>_> *this)

{
  undefined8 *in_RDI;
  Registrar<diy::RegularLink<diy::Bounds<double>_>_> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffec;
  Bounds<double> *in_stack_fffffffffffffff0;
  
  Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<double>_>_>::Registrar
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_id_abi_cxx11__001afac8;
  *(undefined4 *)(in_RDI + 4) = 0;
  std::
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  ::map((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         *)0x16af6b);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x16af7e);
  Bounds<double>::Bounds(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  Bounds<double>::Bounds(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>::vector
            ((vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_> *)0x16afbb);
  std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>::vector
            ((vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_> *)0x16afcc);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x16afdd);
  return;
}

Assistant:

RegularLink():
                  dim_(0), core_(0), bounds_(0)               {}